

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

int mixed_buffer_to_pack(mixed_buffer **ins,mixed_pack *out,float *volume,float target_volume)

{
  byte bVar1;
  mixed_encoding encoding;
  mixed_buffer *pmVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  void *pvVar6;
  char *pack;
  float fVar7;
  float fVar8;
  byte bVar9;
  uint32_t uVar10;
  ulong uVar11;
  int8_t c;
  char cVar12;
  uint32_t i;
  float *apfStack_70 [2];
  float **local_60;
  float *local_58;
  void *local_50;
  char *outd;
  float local_40;
  uint local_3c;
  float local_38;
  uint32_t local_34 [2];
  uint32_t frames;
  
  bVar1 = out->channels;
  apfStack_70[0] = (float *)0x12b0d1;
  local_58 = volume;
  local_38 = target_volume;
  bVar9 = mixed_samplesize(out->encoding);
  local_34[0] = 0xffffffff;
  lVar4 = -(ulong)((uint)bVar1 * 8 + 0xf & 0xfffffff0);
  local_60 = apfStack_70 + 1;
  outd = (char *)out;
  *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12b10b;
  mixed_pack_request_write(&local_50,local_34,out);
  local_34[0] = local_34[0] / ((uint)bVar9 * (uint)bVar1);
  local_3c = (uint)bVar9 * (uint)bVar1;
  for (uVar11 = 0; (uint)bVar1 * 8 != uVar11; uVar11 = uVar11 + 8) {
    pmVar2 = *(mixed_buffer **)((long)ins + uVar11);
    *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12b13d;
    mixed_buffer_request_read
              ((float **)((long)apfStack_70 + uVar11 + lVar4 + -0x68 + 0x70),local_34,pmVar2);
  }
  if (local_34[0] == 0) {
    uVar10 = 0;
  }
  else {
    encoding = *(mixed_encoding *)(outd + 0x18);
    apfStack_70[1] = (float *)transfer_array_functions_to[encoding - MIXED_INT8];
    *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12b167;
    bVar9 = mixed_samplesize(encoding);
    local_40 = *local_58;
    *local_58 = local_38;
    for (cVar12 = '\0'; uVar10 = local_34[0], fVar8 = local_38, fVar7 = local_40, pvVar6 = local_50,
        pfVar5 = apfStack_70[1], (int)cVar12 < (int)(uint)bVar1; cVar12 = cVar12 + '\x01') {
      pfVar3 = *(float **)((long)apfStack_70 + (long)cVar12 * 8 + lVar4 + -0x68 + 0x70U);
      *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12b1ac;
      (*(code *)pfVar5)(pfVar3,pvVar6,bVar1,uVar10,fVar7,fVar8);
      local_50 = (void *)((long)local_50 + (ulong)bVar9);
    }
  }
  pack = outd;
  uVar10 = uVar10 * local_3c;
  *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12b1c9;
  mixed_pack_finish_write(uVar10,(mixed_pack *)pack);
  for (uVar11 = 0; uVar10 = local_34[0], bVar1 != uVar11; uVar11 = uVar11 + 1) {
    pmVar2 = ins[uVar11];
    *(undefined8 *)((long)apfStack_70 + lVar4) = 0x12b1dd;
    mixed_buffer_finish_read(uVar10,pmVar2);
  }
  local_60[0xffffffffffffffff] = (float *)0x1;
  return (int)local_60[0xffffffffffffffff];
}

Assistant:

int mixed_buffer_to_pack(struct mixed_buffer **ins, struct mixed_pack *out, float *volume, float target_volume){
  mixed_channel_t channels = out->channels;
  uint32_t frames_to_bytes = channels * mixed_samplesize(out->encoding);
  uint32_t frames = UINT32_MAX;
  char *outd;
  float *ind[channels];

  mixed_pack_request_write((void**)&outd, &frames, out);
  frames = frames / frames_to_bytes;
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_request_read(&ind[i], &frames, ins[i]);

  if(0 < frames){
    mixed_transfer_function_to fun = transfer_array_functions_to[out->encoding-1];
    uint8_t size = mixed_samplesize(out->encoding);
    float vol = *volume;
    // KLUDGE: this is not necessarily correct...
    *volume = target_volume;
    for(int8_t c=0; c<channels; ++c){
      fun(ind[c], outd, channels, frames, vol, target_volume);
      outd += size;
    }
  }

  mixed_pack_finish_write(frames * frames_to_bytes, out);
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_finish_read(frames, ins[i]);
  
  return 1;
}